

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Formatter.hpp
# Opt level: O2

string * __thiscall
CLI::Formatter::make_groups_abi_cxx11_
          (string *__return_storage_ptr__,Formatter *this,App *app,AppFormatMode mode)

{
  pointer pbVar1;
  __type_conflict _Var2;
  pointer __str;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  groups;
  vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_> opts;
  stringstream out;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_260;
  _Vector_base<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_> local_248;
  anon_class_24_3_0701af66 local_230;
  _Vector_base<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_> local_210;
  string local_1f8 [32];
  function<bool_(const_CLI::Option_*)> local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8;
  
  ::std::__cxx11::stringstream::stringstream(local_1b8);
  App::get_groups_abi_cxx11_(&local_260,app);
  pbVar1 = local_260.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (__str = local_260.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start; __str != pbVar1; __str = __str + 1) {
    local_230.app = app;
    local_230.mode = mode;
    local_230.group = __str;
    ::std::function<bool(CLI::Option_const*)>::
    function<CLI::Formatter::make_groups[abi:cxx11](CLI::App_const*,CLI::AppFormatMode)const::_lambda(CLI::Option_const*)_1_,void>
              ((function<bool(CLI::Option_const*)> *)&local_1d8,&local_230);
    App::get_options((vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_> *)&local_248
                     ,app,&local_1d8);
    std::_Function_base::~_Function_base(&local_1d8.super__Function_base);
    if ((__str->_M_string_length != 0) &&
       (local_248._M_impl.super__Vector_impl_data._M_start !=
        local_248._M_impl.super__Vector_impl_data._M_finish)) {
      ::std::__cxx11::string::string(local_1f8,__str);
      std::vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>::vector
                ((vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_> *)&local_210,
                 (vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_> *)&local_248);
      (*(this->super_FormatterBase)._vptr_FormatterBase[3])(&local_230,this,local_1f8,0,&local_210);
      ::std::operator<<(&local_1a8,(string *)&local_230);
      ::std::__cxx11::string::~string((string *)&local_230);
      std::_Vector_base<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>::~_Vector_base
                (&local_210);
      ::std::__cxx11::string::~string(local_1f8);
      _Var2 = ::std::operator==(__str,local_260.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish + -1);
      if (!_Var2) {
        ::std::operator<<(&local_1a8,"\n");
      }
    }
    std::_Vector_base<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>::~_Vector_base
              (&local_248);
  }
  ::std::__cxx11::stringbuf::str();
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_260);
  ::std::__cxx11::stringstream::~stringstream(local_1b8);
  return __return_storage_ptr__;
}

Assistant:

inline std::string Formatter::make_groups(const App *app, AppFormatMode mode) const {
    std::stringstream out;
    std::vector<std::string> groups = app->get_groups();

    // Options
    for(const std::string &group : groups) {
        std::vector<const Option *> opts = app->get_options([app, mode, &group](const Option *opt) {
            return opt->get_group() == group                     // Must be in the right group
                   && opt->nonpositional()                       // Must not be a positional
                   && (mode != AppFormatMode::Sub                // If mode is Sub, then
                       || (app->get_help_ptr() != opt            // Ignore help pointer
                           && app->get_help_all_ptr() != opt));  // Ignore help all pointer
        });
        if(!group.empty() && !opts.empty()) {
            out << make_group(group, false, opts);

            if(group != groups.back())
                out << "\n";
        }
    }

    return out.str();
}